

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O0

void flat_forward_list_validate_array_test1<5ul>
               (char *title,bool expected_to_be_valid,FLAT_FORWARD_LIST_TEST (*a) [5])

{
  default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *in_R8;
  undefined1 local_68 [16];
  type *local_58;
  type *buffer_view;
  type_conflict *is_valid;
  pair<bool,_iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>_>
  local_40;
  iffl *local_20;
  FLAT_FORWARD_LIST_TEST (*a_local) [5];
  char *pcStack_10;
  bool expected_to_be_valid_local;
  char *title_local;
  
  local_20 = (iffl *)a;
  a_local._7_1_ = expected_to_be_valid;
  pcStack_10 = title;
  printf("-----\"%s\"-----\n",title);
  iffl::
  flat_forward_list_validate<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,iffl::default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
            (&local_40,local_20,(_FLAT_FORWARD_LIST_TEST *)(local_20 + 0x78),
             (_FLAT_FORWARD_LIST_TEST *)((long)&is_valid + 7),in_R8);
  buffer_view = (type *)std::
                        get<0ul,bool,iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
                                  (&local_40);
  local_58 = std::
             get<1ul,bool,iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
                       (&local_40);
  if ((*(byte *)&(buffer_view->buffer_).begin & 1) == (a_local._7_1_ & 1)) {
    if (((ulong)(buffer_view->buffer_).begin & 1) != 0) {
      iffl::
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::begin((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)(local_68 + 8));
      iffl::
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::end((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
             *)local_68);
      std::
      for_each<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,flat_forward_list_validate_array_test1<5ul>(char_const*,bool,_FLAT_FORWARD_LIST_TEST_const(&)[5ul])::_lambda(_FLAT_FORWARD_LIST_TEST_const&)_1_>
                ((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)(local_68 + 8),
                 (flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                  *)local_68);
    }
    std::
    pair<bool,_iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>_>
    ::~pair(&local_40);
    return;
  }
  std::terminate();
}

Assistant:

void flat_forward_list_validate_array_test1(char const * title, bool expected_to_be_valid, FLAT_FORWARD_LIST_TEST const (&a)[N]) {
    std::printf("-----\"%s\"-----\n", title);
    auto[is_valid, buffer_view] = iffl::flat_forward_list_validate(a, a + N);
    FFL_CODDING_ERROR_IF_NOT(is_valid == expected_to_be_valid);

    if (is_valid) {
        std::for_each(buffer_view.begin(), 
                      buffer_view.end(), 
                      [](FLAT_FORWARD_LIST_TEST const &e) noexcept {
            print_element(e);
        });
    }
}